

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<char16_t>::SubtractRange
          (CharSet<char16_t> *this,ArenaAllocator *allocator,Char lowerChar,Char higherChar)

{
  CharSetNode *pCVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  undefined4 extraout_var;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint maxDirectValue;
  uint value;
  uint i;
  uint higherValue;
  uint lowerValue;
  Char higherChar_local;
  Char lowerChar_local;
  ArenaAllocator *allocator_local;
  CharSet<char16_t> *this_local;
  
  higherValue._0_2_ = higherChar;
  higherValue._2_2_ = lowerChar;
  _lowerValue = allocator;
  allocator_local = (ArenaAllocator *)this;
  i = Chars<char16_t>::CTU(lowerChar);
  value = Chars<char16_t>::CTU((Char)higherValue);
  if (i <= value) {
    bVar3 = IsCompact(this);
    if (bVar3) {
      maxDirectValue = 0;
      while (uVar2 = maxDirectValue, uVar4 = GetCompactLength(this), uVar2 < uVar4) {
        local_2c = GetCompactCharU(this,maxDirectValue);
        if ((local_2c < i) || (value < local_2c)) {
          maxDirectValue = maxDirectValue + 1;
        }
        else {
          RemoveCompactChar(this,maxDirectValue);
        }
      }
    }
    else if ((i == 0) && (value == 0xffff)) {
      Clear(this,_lowerValue);
    }
    else {
      if (i < 0x100) {
        local_34 = 0xff;
        puVar6 = min<unsigned_int>(&value,&local_34);
        local_30 = *puVar6;
        CharBitvec::ClearRange(&(this->rep).full.direct,i,local_30);
      }
      if ((this->rep).compact.countPlusOne != 0) {
        pCVar1 = (this->rep).full.root;
        iVar5 = (*pCVar1->_vptr_CharSetNode[3])(pCVar1,_lowerValue,2,(ulong)i,(ulong)value);
        (this->rep).compact.countPlusOne = CONCAT44(extraout_var,iVar5);
      }
    }
  }
  return;
}

Assistant:

void CharSet<char16>::SubtractRange(ArenaAllocator* allocator, Char lowerChar, Char higherChar)
    {
        uint lowerValue = CTU(lowerChar);
        uint higherValue = CTU(higherChar);

        if (higherValue < lowerValue)
            return;

        if (IsCompact())
        {
            for (uint i = 0; i < this->GetCompactLength(); )
            {
                uint value = this->GetCompactCharU(i);

                if (value >= lowerValue && value <= higherValue)
                {
                    this->RemoveCompactChar(i);
                }
                else
                {
                    i++;
                }
            }
        }
        else if(lowerValue == 0 && higherValue == MaxUChar)
        {
            this->Clear(allocator);
        }
        else
        {
            if (lowerValue < CharSetNode::directSize)
            {
                uint maxDirectValue = min(higherValue, CharSetNode::directSize - 1);
                rep.full.direct.ClearRange(lowerValue, maxDirectValue);
            }

            if (rep.full.root != nullptr)
            {
                rep.full.root = rep.full.root->ClearRange(allocator, CharSetNode::levels - 1, lowerValue, higherValue);
            }
        }
    }